

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmInt.h
# Opt level: O3

Mpm_Cut_t * Mpm_ObjCutBestP(Mpm_Man_t *p,Mig_Obj_t *pObj)

{
  int iVar1;
  Mmr_Step_t *pMVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  
  uVar5 = (ulong)pObj >> 1 & 0x7fffffff;
  if ((p->vCutBests).nSize <= (int)uVar5) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar4 = (p->vCutBests).pArray[uVar5];
  pMVar2 = p->pManCuts;
  uVar7 = pMVar2->uMask & uVar4;
  if ((int)uVar7 < 1) {
    __assert_fail("(h & p->uMask) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/mem/mem2.h"
                  ,0xee,"word *Mmr_StepEntry(Mmr_Step_t *, int)");
  }
  uVar4 = (int)uVar4 >> ((byte)pMVar2->nBits & 0x1f);
  if (0 < (int)uVar4) {
    iVar1 = *(int *)((long)pMVar2 + (ulong)uVar7 * 0x38 + 0x34);
    bVar6 = (byte)*(undefined4 *)((long)pMVar2 + (ulong)uVar7 * 0x38 + 0x18);
    if ((int)uVar4 < iVar1 << (bVar6 & 0x1f)) {
      uVar8 = uVar4 >> (bVar6 & 0x1f);
      if (iVar1 <= (int)uVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      lVar3 = *(long *)(*(long *)((long)pMVar2 + (ulong)uVar7 * 0x38 + 0x38) + (ulong)uVar8 * 8);
      uVar5 = (ulong)(uVar4 & *(uint *)((long)pMVar2 + (ulong)uVar7 * 0x38 + 0x1c));
      if ((*(uint *)(lVar3 + 4 + uVar5 * 8) >> 0x19) + 0xc >> 3 == uVar7) {
        return (Mpm_Cut_t *)(lVar3 + uVar5 * 8);
      }
      __assert_fail("Mpm_CutWordNum(pCut->nLeaves) == (h & p->pManCuts->uMask)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmInt.h"
                    ,0xaf,"Mpm_Cut_t *Mpm_CutFetch(Mpm_Man_t *, int)");
    }
  }
  __assert_fail("h > 0 && h < (Vec_PtrSize(&p->vPages) << p->nPageBase)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/mem/mem2.h"
                ,0xb2,"word *Mmr_FixedEntry(Mmr_Fixed_t *, int)");
}

Assistant:

static inline Mpm_Cut_t * Mpm_ObjCutBestP( Mpm_Man_t * p, Mig_Obj_t * pObj )             { return Mpm_CutFetch( p, Mpm_ObjCutBest(p, pObj) );              }